

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *pCVar2;
  _Alloc_hider name;
  int extraout_EAX;
  TestNode *node;
  InputType type;
  InputType type_00;
  long lVar3;
  string local_70;
  string local_50;
  
  lVar3 = 0;
  do {
    node = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(uint *)((long)&DAT_01c76284 + lVar3);
    deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_50,(Array *)(ulong)uVar1,type);
    name._M_p = local_50._M_dataplus._M_p;
    deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_70,(Array *)(ulong)uVar1,type_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,pCVar2->m_testCtx,name._M_p,local_70._M_dataplus._M_p);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
    node[1]._vptr_TestNode = (_func_int **)pCVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a2d10;
    *(uint *)&node[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,node);
    lVar3 = lVar3 + 4;
  } while (lVar3 == 4);
  return extraout_EAX;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test offset with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayOffsetGroup(m_context, inputTypes[inputTypeNdx]));
	}
}